

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype QtPrivate::findString
                    (QStringView haystack0,qsizetype from,QStringView needle0,CaseSensitivity cs)

{
  QStringView needle_00;
  QStringView haystack_00;
  QStringView str;
  QChar QVar1;
  int iVar2;
  ulong uVar4;
  qsizetype qVar5;
  storage_type_conflict *psVar6;
  storage_type_conflict *psVar7;
  char32_t cVar3;
  long lVar8;
  long in_RDX;
  int in_R9D;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  char16_t *haystack_start;
  qsizetype idx;
  qregisteruint hashHaystack;
  qregisteruint hashNeedle;
  qregisteruint sl_minus_1;
  char16_t *end;
  char16_t *haystack;
  char16_t *needle;
  qsizetype sl;
  qsizetype l;
  anon_class_8_1_3fcf6717 sv;
  char16_t *in_stack_fffffffffffffeb8;
  char16_t *in_stack_fffffffffffffec0;
  QStringView *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffee8;
  QStringView in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar11;
  CaseSensitivity in_stack_ffffffffffffff04;
  undefined4 uVar12;
  qsizetype in_stack_ffffffffffffff08;
  storage_type_conflict *in_stack_ffffffffffffff10;
  qsizetype in_stack_ffffffffffffff18;
  long lVar13;
  long local_e0;
  long local_d8;
  storage_type_conflict *local_c0;
  undefined8 in_stack_ffffffffffffff48;
  QChar ch;
  undefined6 in_stack_ffffffffffffff50;
  long local_90;
  qsizetype local_88;
  QStringView local_28;
  QStringView local_18;
  long local_8;
  
  ch.ucs = (char16_t)((ulong)in_stack_ffffffffffffff48 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = QStringView::size(&local_18);
  qVar5 = QStringView::size(&local_28);
  if (qVar5 == 1) {
    QVar1 = QStringView::operator[](in_stack_fffffffffffffec8,(qsizetype)in_stack_fffffffffffffec0);
    str.m_data._6_2_ = QVar1.ucs;
    str.m_data._0_6_ = in_stack_ffffffffffffff50;
    str.m_size = qVar5;
    local_88 = findString(str,in_stack_ffffffffffffff08,ch,in_stack_ffffffffffffff04);
  }
  else {
    local_90 = in_RDX;
    if (in_RDX < 0) {
      local_90 = uVar4 + in_RDX;
    }
    if (uVar4 < (ulong)(qVar5 + local_90)) {
      local_88 = -1;
    }
    else if (qVar5 == 0) {
      local_88 = local_90;
    }
    else if (uVar4 == 0) {
      local_88 = -1;
    }
    else if (((long)uVar4 < 0x1f5) || (qVar5 < 6)) {
      psVar6 = QStringView::utf16(&local_28);
      local_c0 = QStringView::utf16(&local_18);
      local_c0 = local_c0 + local_90;
      psVar7 = QStringView::utf16(&local_18);
      lVar8 = uVar4 - qVar5;
      uVar4 = qVar5 - 1;
      local_d8 = 0;
      local_e0 = 0;
      if (in_R9D == 1) {
        for (lVar13 = 0; lVar13 < qVar5; lVar13 = lVar13 + 1) {
          local_d8 = local_d8 * 2 + (ulong)(ushort)psVar6[lVar13];
          local_e0 = local_e0 * 2 + (ulong)(ushort)local_c0[lVar13];
        }
        local_e0 = local_e0 - (ulong)(ushort)local_c0[uVar4];
        for (; local_c0 <= psVar7 + lVar8; local_c0 = local_c0 + 1) {
          local_e0 = (ulong)(ushort)local_c0[uVar4] + local_e0;
          if (local_e0 == local_d8) {
            QVar9 = findString::anon_class_8_1_3fcf6717::operator()
                              ((anon_class_8_1_3fcf6717 *)in_stack_fffffffffffffec8,
                               in_stack_fffffffffffffec0);
            QVar10.m_data._4_4_ = in_stack_ffffffffffffff04;
            QVar10.m_data._0_4_ = in_stack_ffffffffffffff00;
            QVar10.m_size = (qsizetype)QVar9.m_data;
            iVar2 = compareStrings(QVar10,in_stack_fffffffffffffef0,
                                   (CaseSensitivity)in_stack_fffffffffffffee8);
            if (iVar2 == 0) {
              psVar6 = QStringView::utf16(&local_18);
              local_88 = (long)local_c0 - (long)psVar6 >> 1;
              goto LAB_001d6f33;
            }
          }
          if (uVar4 < 0x40) {
            local_e0 = local_e0 - ((ulong)(ushort)*local_c0 << ((byte)uVar4 & 0x3f));
          }
          local_e0 = local_e0 << 1;
        }
      }
      else {
        psVar6 = QStringView::utf16(&local_18);
        uVar11 = SUB84(psVar6,0);
        uVar12 = (undefined4)((ulong)psVar6 >> 0x20);
        for (lVar13 = 0; lVar13 < qVar5; lVar13 = lVar13 + 1) {
          cVar3 = foldCase(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          local_d8 = local_d8 * 2 + (ulong)(uint)cVar3;
          cVar3 = foldCase(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          local_e0 = local_e0 * 2 + (ulong)(uint)cVar3;
        }
        cVar3 = foldCase(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        local_e0 = local_e0 - (ulong)(uint)cVar3;
        for (; local_c0 <= psVar7 + lVar8; local_c0 = local_c0 + 1) {
          cVar3 = foldCase(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          local_e0 = (ulong)(uint)cVar3 + local_e0;
          if (local_e0 == local_d8) {
            QVar10 = findString::anon_class_8_1_3fcf6717::operator()
                               ((anon_class_8_1_3fcf6717 *)in_stack_fffffffffffffec8,
                                in_stack_fffffffffffffec0);
            QVar9.m_data._4_4_ = uVar12;
            QVar9.m_data._0_4_ = uVar11;
            QVar9.m_size = in_stack_ffffffffffffff08;
            iVar2 = compareStrings(QVar9,QVar10,(CaseSensitivity)in_stack_fffffffffffffee8);
            if (iVar2 == 0) {
              psVar6 = QStringView::utf16(&local_18);
              local_88 = (long)local_c0 - (long)psVar6 >> 1;
              goto LAB_001d6f33;
            }
          }
          if (uVar4 < 0x40) {
            cVar3 = foldCase(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            local_e0 = local_e0 - ((ulong)(uint)cVar3 << ((byte)uVar4 & 0x3f));
          }
          local_e0 = local_e0 << 1;
        }
      }
      local_88 = -1;
    }
    else {
      haystack_00.m_size = in_stack_ffffffffffffff18;
      haystack_00.m_data = in_stack_ffffffffffffff10;
      needle_00.m_data._4_4_ = in_stack_ffffffffffffff04;
      needle_00.m_data._0_4_ = in_stack_ffffffffffffff00;
      needle_00.m_size = in_stack_ffffffffffffff08;
      local_88 = qFindStringBoyerMoore
                           (haystack_00,(qsizetype)in_stack_fffffffffffffec8,needle_00,
                            (CaseSensitivity)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    }
  }
LAB_001d6f33:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_88;
}

Assistant:

qsizetype QtPrivate::findString(QStringView haystack0, qsizetype from, QStringView needle0, Qt::CaseSensitivity cs) noexcept
{
    const qsizetype l = haystack0.size();
    const qsizetype sl = needle0.size();
    if (sl == 1)
        return findString(haystack0, from, needle0[0], cs);
    if (from < 0)
        from += l;
    if (std::size_t(sl + from) > std::size_t(l))
        return -1;
    if (!sl)
        return from;
    if (!l)
        return -1;

    /*
        We use the Boyer-Moore algorithm in cases where the overhead
        for the skip table should pay off, otherwise we use a simple
        hash function.
    */
    if (l > 500 && sl > 5)
        return qFindStringBoyerMoore(haystack0, from, needle0, cs);

    auto sv = [sl](const char16_t *v) { return QStringView(v, sl); };
    /*
        We use some hashing for efficiency's sake. Instead of
        comparing strings, we compare the hash value of str with that
        of a part of this QString. Only if that matches, we call
        qt_string_compare().
    */
    const char16_t *needle = needle0.utf16();
    const char16_t *haystack = haystack0.utf16() + from;
    const char16_t *end = haystack0.utf16() + (l - sl);
    const qregisteruint sl_minus_1 = sl - 1;
    qregisteruint hashNeedle = 0, hashHaystack = 0;
    qsizetype idx;

    if (cs == Qt::CaseSensitive) {
        for (idx = 0; idx < sl; ++idx) {
            hashNeedle = ((hashNeedle<<1) + needle[idx]);
            hashHaystack = ((hashHaystack<<1) + haystack[idx]);
        }
        hashHaystack -= haystack[sl_minus_1];

        while (haystack <= end) {
            hashHaystack += haystack[sl_minus_1];
            if (hashHaystack == hashNeedle
                 && QtPrivate::compareStrings(needle0, sv(haystack), Qt::CaseSensitive) == 0)
                return haystack - haystack0.utf16();

            REHASH(*haystack);
            ++haystack;
        }
    } else {
        const char16_t *haystack_start = haystack0.utf16();
        for (idx = 0; idx < sl; ++idx) {
            hashNeedle = (hashNeedle<<1) + foldCase(needle + idx, needle);
            hashHaystack = (hashHaystack<<1) + foldCase(haystack + idx, haystack_start);
        }
        hashHaystack -= foldCase(haystack + sl_minus_1, haystack_start);

        while (haystack <= end) {
            hashHaystack += foldCase(haystack + sl_minus_1, haystack_start);
            if (hashHaystack == hashNeedle
                 && QtPrivate::compareStrings(needle0, sv(haystack), Qt::CaseInsensitive) == 0)
                return haystack - haystack0.utf16();

            REHASH(foldCase(haystack, haystack_start));
            ++haystack;
        }
    }
    return -1;
}